

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O2

void __thiscall OSTEI_HRR_Writer::WriteHRR(OSTEI_HRR_Writer *this,ostream *os)

{
  QAM *pQVar1;
  OSTEI_HRR_Algorithm_Base *this_00;
  bool bVar2;
  int iVar3;
  DoubletType DVar4;
  ostream *poVar5;
  _Rb_tree_node_base *p_Var6;
  ostream *poVar7;
  _Alloc_hider _Var8;
  string *psVar9;
  QAM am;
  QAM finalam;
  allocator local_2e1;
  OSTEI_HRR_Writer *local_2e0;
  ostream *local_2d8;
  undefined1 local_2d0 [12];
  int local_2c4;
  string local_2c0 [32];
  string local_2a0;
  string local_280;
  string local_260;
  undefined1 local_240 [48];
  undefined1 local_210 [48];
  undefined1 local_1e0 [48];
  undefined1 local_1b0 [48];
  undefined1 local_180 [48];
  undefined1 local_150 [48];
  undefined1 local_120 [48];
  undefined1 local_f0 [48];
  QAM local_c0;
  QAM local_90;
  undefined1 local_60 [48];
  
  local_2e0 = this;
  QAM::QAM((QAM *)local_240,&(this->info_->super_GeneratorInfoBase).finalam_);
  poVar5 = std::operator<<(os,(string *)&indent3_abi_cxx11_);
  std::operator<<(poVar5,"//////////////////////////////////////////////\n");
  poVar5 = std::operator<<(os,(string *)&indent3_abi_cxx11_);
  std::operator<<(poVar5,"// Contracted integrals: Horizontal recurrance\n");
  poVar5 = std::operator<<(os,(string *)&indent3_abi_cxx11_);
  std::operator<<(poVar5,"//////////////////////////////////////////////\n");
  std::operator<<(os,"\n\n");
  bVar2 = OSTEI_HRR_Algorithm_Base::HasBraHRR(local_2e0->hrr_algo_);
  if (bVar2) {
    poVar5 = std::operator<<(os,(string *)&indent3_abi_cxx11_);
    std::operator<<(poVar5,"const double hAB[3] = { P.AB_x[ab], P.AB_y[ab], P.AB_z[ab] };\n");
  }
  std::operator<<(os,"\n\n");
  poVar5 = std::operator<<(os,(string *)&indent3_abi_cxx11_);
  std::operator<<(poVar5,"for(abcd = 0; abcd < nshellbatch; ++abcd, ++real_abcd)\n");
  poVar5 = std::operator<<(os,(string *)&indent3_abi_cxx11_);
  std::operator<<(poVar5,"{\n");
  bVar2 = OSTEI_HRR_Algorithm_Base::HasKetHRR(local_2e0->hrr_algo_);
  if (bVar2) {
    poVar5 = std::operator<<(os,(string *)&indent4_abi_cxx11_);
    std::operator<<(poVar5,
                    "const double hCD[3] = { Q.AB_x[cd+abcd], Q.AB_y[cd+abcd], Q.AB_z[cd+abcd] };\n"
                   );
  }
  std::operator<<(os,"\n");
  poVar5 = std::operator<<(os,(string *)&indent4_abi_cxx11_);
  std::operator<<(poVar5,"// set up HRR pointers\n");
  local_2d8 = os;
  OSTEI_HRR_Algorithm_Base::TopAM((QAMSet *)local_2d0,local_2e0->hrr_algo_);
  for (p_Var6 = (_Rb_tree_node_base *)local_2c0._8_8_;
      p_Var6 != (_Rb_tree_node_base *)(local_2d0 + 8);
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    poVar5 = std::operator<<(local_2d8,(string *)&indent4_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"double const * restrict ");
    pQVar1 = (QAM *)(p_Var6 + 1);
    HRRVarName_abi_cxx11_(&local_280,pQVar1);
    poVar5 = std::operator<<(poVar5,(string *)&local_280);
    poVar5 = std::operator<<(poVar5," = ");
    std::__cxx11::string::string((string *)&local_260,"",&local_2e1);
    ArrVarName(&local_2a0,pQVar1,&local_260);
    poVar5 = std::operator<<(poVar5,(string *)&local_2a0);
    poVar5 = std::operator<<(poVar5," + abcd * ");
    QAM::QAM((QAM *)local_60,pQVar1);
    iVar3 = NCART((QAM *)local_60);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar3);
    std::operator<<(poVar5,";\n");
    std::__cxx11::string::~string((string *)(local_60 + 0x10));
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_280);
  }
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            ((_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> *)
             local_2d0);
  poVar5 = local_2d8;
  iVar3 = (local_2e0->info_->super_GeneratorInfoBase).deriv_;
  if (iVar3 == 0) {
    poVar7 = std::operator<<(local_2d8,(string *)&indent4_abi_cxx11_);
    poVar7 = std::operator<<(poVar7,"double * restrict ");
    HRRVarName_abi_cxx11_((string *)local_2d0,(QAM *)local_240);
    poVar7 = std::operator<<(poVar7,(string *)local_2d0);
    poVar7 = std::operator<<(poVar7," = ");
    std::__cxx11::string::string((string *)&local_2a0,"",(allocator *)&local_260);
    ArrVarName(&local_280,(QAM *)local_240,&local_2a0);
    poVar7 = std::operator<<(poVar7,(string *)&local_280);
    poVar7 = std::operator<<(poVar7," + real_abcd * ");
    QAM::QAM(&local_90,(QAM *)local_240);
    iVar3 = NCART(&local_90);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar3);
    std::operator<<(poVar7,";\n");
    pQVar1 = &local_90;
  }
  else {
    if (iVar3 != 1) goto LAB_0011b90e;
    poVar7 = std::operator<<(local_2d8,(string *)&indent4_abi_cxx11_);
    poVar7 = std::operator<<(poVar7,"double * restrict ");
    HRRVarName_abi_cxx11_((string *)local_2d0,(QAM *)local_240);
    poVar7 = std::operator<<(poVar7,(string *)local_2d0);
    poVar7 = std::operator<<(poVar7," = ");
    std::__cxx11::string::string((string *)&local_2a0,"",(allocator *)&local_260);
    ArrVarName(&local_280,(QAM *)local_240,&local_2a0);
    poVar7 = std::operator<<(poVar7,(string *)&local_280);
    poVar7 = std::operator<<(poVar7," + real_abcd * ");
    QAM::QAM(&local_c0,(QAM *)local_240);
    iVar3 = NCART(&local_c0);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar3);
    std::operator<<(poVar7," * 12;\n");
    pQVar1 = &local_c0;
  }
  std::__cxx11::string::~string((string *)&pQVar1->tag);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)local_2d0);
LAB_0011b90e:
  std::operator<<(poVar5,"\n");
  OSTEI_HRR_Algorithm_Base::GetAMOrder((QAMList *)&local_260,local_2e0->hrr_algo_);
  for (_Var8._M_p = local_260._M_dataplus._M_p; _Var8._M_p != (pointer)local_260._M_string_length;
      _Var8._M_p = _Var8._M_p + 0x30) {
    QAM::QAM((QAM *)local_2d0,(QAM *)_Var8._M_p);
    this_00 = local_2e0->hrr_algo_;
    QAM::QAM((QAM *)local_f0,(QAM *)local_2d0);
    DVar4 = OSTEI_HRR_Algorithm_Base::GetDoubletStep(this_00,(QAM *)local_f0);
    std::__cxx11::string::~string((string *)(local_f0 + 0x10));
    if (DVar4 == BRA) {
      poVar5 = std::operator<<(local_2d8,(string *)&indent4_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,"// form ");
      std::__cxx11::string::string((string *)&local_2a0,"",&local_2e1);
      ArrVarName(&local_280,(QAM *)local_2d0,&local_2a0);
      poVar5 = std::operator<<(poVar5,(string *)&local_280);
      std::operator<<(poVar5,"\n");
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
      if ((int)(local_2d0._4_4_ + local_2d0._0_4_) < local_2e0->start_external_) {
        QAM::QAM((QAM *)local_120,(QAM *)local_2d0);
        poVar5 = local_2d8;
        WriteHRR_Bra_Inline_(local_2e0,local_2d8,(QAM *)local_120);
        psVar9 = (string *)(local_120 + 0x10);
      }
      else if ((int)(local_2d0._4_4_ + local_2d0._0_4_) < local_2e0->start_general_) {
        QAM::QAM((QAM *)local_150,(QAM *)local_2d0);
        poVar5 = local_2d8;
        WriteHRR_Bra_External_(local_2e0,local_2d8,(QAM *)local_150);
        psVar9 = (string *)(local_150 + 0x10);
      }
      else {
        QAM::QAM((QAM *)local_180,(QAM *)local_2d0);
        poVar5 = local_2d8;
        WriteHRR_Bra_General_(local_2e0,local_2d8,(QAM *)local_180);
        psVar9 = (string *)(local_180 + 0x10);
      }
      std::__cxx11::string::~string(psVar9);
      std::operator<<(poVar5,"\n");
    }
    else {
      poVar5 = std::operator<<(local_2d8,(string *)&indent4_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,"// form ");
      std::__cxx11::string::string((string *)&local_2a0,"",&local_2e1);
      ArrVarName(&local_280,(QAM *)local_2d0,&local_2a0);
      poVar5 = std::operator<<(poVar5,(string *)&local_280);
      std::operator<<(poVar5,"\n");
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
      if (local_2c4 + local_2d0._8_4_ < local_2e0->start_external_) {
        QAM::QAM((QAM *)local_1b0,(QAM *)local_2d0);
        poVar5 = local_2d8;
        WriteHRR_Ket_Inline_(local_2e0,local_2d8,(QAM *)local_1b0);
        psVar9 = (string *)(local_1b0 + 0x10);
      }
      else if (local_2c4 + local_2d0._8_4_ < local_2e0->start_general_) {
        QAM::QAM((QAM *)local_1e0,(QAM *)local_2d0);
        poVar5 = local_2d8;
        WriteHRR_Ket_External_(local_2e0,local_2d8,(QAM *)local_1e0);
        psVar9 = (string *)(local_1e0 + 0x10);
      }
      else {
        QAM::QAM((QAM *)local_210,(QAM *)local_2d0);
        poVar5 = local_2d8;
        WriteHRR_Ket_General_(local_2e0,local_2d8,(QAM *)local_210);
        psVar9 = (string *)(local_210 + 0x10);
      }
      std::__cxx11::string::~string(psVar9);
      std::operator<<(poVar5,"\n");
    }
    std::__cxx11::string::~string(local_2c0);
  }
  std::vector<QAM,_std::allocator<QAM>_>::~vector((vector<QAM,_std::allocator<QAM>_> *)&local_260);
  std::__cxx11::string::~string((string *)(local_240 + 0x10));
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteHRR(std::ostream & os) const
{
    QAM finalam = info_.FinalAM();

    os << indent3 << "//////////////////////////////////////////////\n";
    os << indent3 << "// Contracted integrals: Horizontal recurrance\n";
    os << indent3 << "//////////////////////////////////////////////\n";
    os << "\n\n";

    if(hrr_algo_.HasBraHRR())
        os << indent3 << "const double hAB[3] = { P.AB_x[ab], P.AB_y[ab], P.AB_z[ab] };\n"; 
    os << "\n\n";

    os << indent3 << "for(abcd = 0; abcd < nshellbatch; ++abcd, ++real_abcd)\n";
    os << indent3 << "{\n";

    if(hrr_algo_.HasKetHRR())
        os << indent4 << "const double hCD[3] = { Q.AB_x[cd+abcd], Q.AB_y[cd+abcd], Q.AB_z[cd+abcd] };\n";
    os << "\n";
    os << indent4 << "// set up HRR pointers\n";
    for(const auto & it : hrr_algo_.TopAM())
        os << indent4 << "double const * restrict " << HRRVarName(it) << " = " << ArrVarName(it) << " + abcd * " << NCART(it) << ";\n";

    // and also for the final integral
    if(info_.Deriv() == 0)
        os << indent4 << "double * restrict " << HRRVarName(finalam) << " = " << ArrVarName(finalam) << " + real_abcd * " << NCART(finalam) << ";\n";
    else if(info_.Deriv() == 1)
        os << indent4 << "double * restrict " << HRRVarName(finalam) << " = " << ArrVarName(finalam) << " + real_abcd * " << NCART(finalam) << " * 12;\n";
    os << "\n";

    for(auto am : hrr_algo_.GetAMOrder())
    {
        DoubletType steptype = hrr_algo_.GetDoubletStep(am);

        if(steptype == DoubletType::BRA)
        {
            os << indent4 << "// form " << ArrVarName(am) << "\n";
            int L = am[0] + am[1];

            if(L < start_external_)
                WriteHRR_Bra_Inline_(os, am);
            else if(L < start_general_)
                WriteHRR_Bra_External_(os, am);
            else
                WriteHRR_Bra_General_(os, am);
            os << "\n";
        }
        else
        {
            os << indent4 << "// form " << ArrVarName(am) << "\n";
            int L = am[2] + am[3];

            if(L < start_external_)
                WriteHRR_Ket_Inline_(os, am);
            else if(L < start_general_)
                WriteHRR_Ket_External_(os, am);
            else
                WriteHRR_Ket_General_(os, am);
            os << "\n";
        }
    }

}